

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O0

void __thiscall ThreadPool::Start(ThreadPool *this,int threadNum)

{
  Thread *this_00;
  reference this_01;
  pointer this_02;
  ThreadPool *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  CallFunc local_40;
  Thread *local_20;
  int local_18;
  int local_14;
  int i;
  int threadNum_local;
  ThreadPool *this_local;
  
  local_14 = threadNum;
  _i = this;
  if ((this->m_bRunning & 1U) != 0) {
    Stop(this);
  }
  std::
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ::reserve(&this->m_threads,(long)local_14);
  this->m_bRunning = true;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    this_00 = (Thread *)operator_new(0x30);
    local_68 = RunInThread;
    local_60 = 0;
    local_70 = this;
    std::bind<void(ThreadPool::*)(),ThreadPool*>
              (&local_58,(offset_in_ThreadPool_to_subr *)&local_68,&local_70);
    std::function<void()>::function<std::_Bind<void(ThreadPool::*(ThreadPool*))()>,void>
              ((function<void()> *)&local_40,&local_58);
    Thread::Thread(this_00,&local_40);
    local_20 = this_00;
    std::
    vector<std::unique_ptr<Thread,std::default_delete<Thread>>,std::allocator<std::unique_ptr<Thread,std::default_delete<Thread>>>>
    ::emplace_back<Thread*>
              ((vector<std::unique_ptr<Thread,std::default_delete<Thread>>,std::allocator<std::unique_ptr<Thread,std::default_delete<Thread>>>>
                *)&this->m_threads,&local_20);
    std::function<void_()>::~function(&local_40);
    this_01 = std::
              vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
              ::operator[](&this->m_threads,(long)local_18);
    this_02 = std::unique_ptr<Thread,_std::default_delete<Thread>_>::operator->(this_01);
    Thread::Start(this_02);
  }
  return;
}

Assistant:

void ThreadPool::Start(int threadNum)
{
	if (m_bRunning)
	{
		Stop();
	}
	
	m_threads.reserve(threadNum);
	m_bRunning = true;
	for (int i = 0; i < threadNum; ++i)
	{
		m_threads.emplace_back(new Thread(std::bind(&ThreadPool::RunInThread, this)));
		m_threads[i]->Start();
	}
}